

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_handler_init_file_ctype(nni_http_handler **hpp,char *uri,char *path,char *ctype)

{
  nng_err nVar1;
  void *data;
  char *pcVar2;
  nng_err rv;
  http_file *hf;
  nni_http_handler *h;
  char *ctype_local;
  char *path_local;
  char *uri_local;
  nni_http_handler **hpp_local;
  
  h = (nni_http_handler *)ctype;
  ctype_local = path;
  path_local = uri;
  uri_local = (char *)hpp;
  data = nni_zalloc(0x18);
  if (data != (void *)0x0) {
    if ((h == (nni_http_handler *)0x0) &&
       (h = (nni_http_handler *)http_lookup_type(ctype_local), h == (nni_http_handler *)0x0)) {
      h = (nni_http_handler *)anon_var_dwarf_3cf61;
    }
    pcVar2 = nni_strdup(ctype_local);
    *(char **)((long)data + 8) = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = nni_strdup((char *)h);
      *(char **)((long)data + 0x10) = pcVar2;
      if (pcVar2 != (char *)0x0) {
        nVar1 = nni_http_handler_init((nni_http_handler **)&hf,path_local,http_handle_file);
        if (nVar1 == NNG_OK) {
          nni_http_handler_set_data((nni_http_handler *)hf,data,http_file_free);
          nni_http_handler_collect_body((nni_http_handler *)hf,true,0);
          *(http_file **)uri_local = hf;
          return NNG_OK;
        }
        http_file_free(data);
        return nVar1;
      }
    }
    http_file_free(data);
  }
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_http_handler_init_file_ctype(nni_http_handler **hpp, const char *uri,
    const char *path, const char *ctype)
{
	nni_http_handler *h;
	http_file        *hf;
	nng_err           rv;

	if ((hf = NNI_ALLOC_STRUCT(hf)) == NULL) {
		return (NNG_ENOMEM);
	}

	// Later we might want to do this in the server side, if we support
	// custom media type lists on a per-server basis.  For now doing this
	// here ensures that we don't have to lookup the type every time.
	if (ctype == NULL) {
		if ((ctype = http_lookup_type(path)) == NULL) {
			ctype = "application/octet-stream";
		}
	}
	if (((hf->path = nni_strdup(path)) == NULL) ||
	    ((hf->ctype = nni_strdup(ctype)) == NULL)) {
		http_file_free(hf);
		return (NNG_ENOMEM);
	}

	if ((rv = nni_http_handler_init(&h, uri, http_handle_file)) != 0) {
		http_file_free(hf);
		return (rv);
	}

	nni_http_handler_set_data(h, hf, http_file_free);

	// We don't permit a body for getting a file.
	nni_http_handler_collect_body(h, true, 0);

	*hpp = h;
	return (NNG_OK);
}